

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror_s.c
# Opt level: O0

int main(void)

{
  errno_t eVar1;
  int iVar2;
  char local_1a [8];
  char s [14];
  
  s[6] = '\0';
  s[7] = '\0';
  s[8] = '\0';
  s[9] = '\0';
  eVar1 = strerror_s(local_1a,0xe,0x84);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strerror_s.c, line %d - %s\n"
           ,0x3d,"strerror_s( s, 14, _PDCLIB_ERRNO_MAX ) == 0");
  }
  iVar2 = strcmp(local_1a,"unknown error");
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strerror_s.c, line %d - %s\n"
           ,0x3e,"strcmp( s, \"unknown error\" ) == 0");
  }
  eVar1 = strerror_s(local_1a,0xd,0x84);
  if (eVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strerror_s.c, line %d - %s\n"
           ,0x3f,"strerror_s( s, 13, _PDCLIB_ERRNO_MAX ) == 0");
  }
  iVar2 = strcmp(local_1a,"unknown e...");
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strerror_s.c, line %d - %s\n"
           ,0x40,"strcmp( s, \"unknown e...\" ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[14];
    TESTCASE( strerror_s( s, 14, _PDCLIB_ERRNO_MAX ) == 0 );
    TESTCASE( strcmp( s, "unknown error" ) == 0 );
    TESTCASE( strerror_s( s, 13, _PDCLIB_ERRNO_MAX ) == 0 );
    TESTCASE( strcmp( s, "unknown e..." ) == 0 );
#endif
    return TEST_RESULTS;
}